

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:974:7)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:974:7)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::_::Void> *pEVar1;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *in;
  Void local_569;
  ExceptionOr<kj::_::Void> local_568;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *local_3c8;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *depValue;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> *_depValue779;
  Exception *local_218;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1f8 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:974:7)>
  *this_local;
  
  depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)output;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::ExceptionOr
            ((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
              *)local_1f8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1f8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1f8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>
                         ((Maybe<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
                           *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                     details.builder + 0x18));
    if (depValue != (Response<capnproto_test::capnp::test::TestInterface::FooResults> *)0x0) {
      local_3c8 = depValue;
      in = mv<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>(depValue);
      MaybeVoidCaller<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,kj::_::Void>
      ::
      apply<capnp::_::TestPipelineImpl::getCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>)::__0>
                (&this->func,in);
      TransformPromiseNodeBase::handle<kj::_::Void>
                (&local_568,&this->super_TransformPromiseNodeBase,&local_569);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_568);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_568);
    }
  }
  else {
    local_218 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779,false,exception)
    ;
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,(ExceptionOr<kj::_::Void> *)&_depValue779);
    ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779);
  }
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::
  ~ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
                *)local_1f8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }